

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_of(StringPiece *this,StringPiece s,size_type pos)

{
  unsigned_long *puVar1;
  StringPiece characters_wanted;
  unsigned_long local_158;
  unsigned_long local_150;
  stringpiece_ssize_type i;
  char *local_140;
  byte local_138 [8];
  bool lookup [256];
  size_type local_30;
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (StringPiece *)s.ptr_;
  if ((this->length_ < 1) || ((long)s_local.ptr_ < 1)) {
    s_local.length_ = -1;
  }
  else {
    local_30 = pos;
    pos_local = (size_type)this;
    if (s_local.ptr_ == (char *)0x1) {
      s_local.length_ = find_last_of(this,*(char *)&this_local->ptr_,pos);
    }
    else {
      memset(local_138,0,0x100);
      i = (stringpiece_ssize_type)this_local;
      local_140 = s_local.ptr_;
      characters_wanted.length_ = (stringpiece_ssize_type)local_138;
      characters_wanted.ptr_ = s_local.ptr_;
      BuildLookupTable((protobuf *)this_local,characters_wanted,(bool *)pos);
      local_158 = this->length_ - 1;
      puVar1 = std::min<unsigned_long>(&local_30,&local_158);
      for (local_150 = *puVar1; -1 < (long)local_150; local_150 = local_150 - 1) {
        if ((local_138[(byte)this->ptr_[local_150]] & 1) != 0) {
          return local_150;
        }
      }
      s_local.length_ = -1;
    }
  }
  return s_local.length_;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i =
       std::min(pos, static_cast<size_type>(length_ - 1)); i >= 0; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}